

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::LoopLayerParams::~LoopLayerParams(LoopLayerParams *this)

{
  LoopLayerParams *this_local;
  
  ~LoopLayerParams(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

LoopLayerParams::~LoopLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.LoopLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}